

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

TimingPathSymbol *
slang::ast::TimingPathSymbol::fromSyntax(Scope *parent,PathDeclarationSyntax *syntax)

{
  PathDescriptionSyntax *pPVar1;
  PathSuffixSyntax *pPVar2;
  SyntaxNode *this;
  EdgeSensitivePathSuffixSyntax *pEVar3;
  Compilation *this_00;
  SourceLocation args_1;
  TimingPathSymbol *this_01;
  EdgeKind *args_4;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  Token TVar4;
  TimingPathSymbol *result;
  Compilation *comp;
  EdgeSensitivePathSuffixSyntax *esps;
  Polarity edgePolarity;
  EdgeKind edgeIdentifier;
  ConnectionKind connectionKind;
  Polarity polarity;
  SourceLocation *in_stack_ffffffffffffffc8;
  
  pPVar1 = not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
                     ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x481acc);
  args_4 = (EdgeKind *)(ulong)(*(int *)&pPVar1->polarityOperator - 0x1eU & 0xffff);
  switch(args_4) {
  case (EdgeKind *)0x0:
  case (EdgeKind *)0x1b:
    break;
  default:
    break;
  case (EdgeKind *)0x5:
  case (EdgeKind *)0x1c:
  }
  not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
            ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x481b1f);
  pPVar1 = not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
                     ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x481b46);
  SemanticFacts::getEdgeKind((pPVar1->edgeIdentifier).kind);
  not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
            ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x481b69);
  pPVar2 = not_null<slang::syntax::PathSuffixSyntax_*>::operator->
                     ((not_null<slang::syntax::PathSuffixSyntax_*> *)0x481b78);
  if ((pPVar2->super_SyntaxNode).kind == EdgeSensitivePathSuffix) {
    not_null<slang::syntax::PathDescriptionSyntax_*>::operator->
              ((not_null<slang::syntax::PathDescriptionSyntax_*> *)0x481b8e);
    this = &not_null<slang::syntax::PathSuffixSyntax_*>::operator->
                      ((not_null<slang::syntax::PathSuffixSyntax_*> *)0x481b9d)->super_SyntaxNode;
    pEVar3 = slang::syntax::SyntaxNode::as<slang::syntax::EdgeSensitivePathSuffixSyntax>(this);
    switch(*(int *)&pEVar3->polarityOperator - 0x1eU & 0xffff) {
    case 0:
    case 2:
      break;
    default:
      break;
    case 5:
    case 7:
    }
  }
  this_00 = Scope::getCompilation(in_RDI);
  TVar4 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this_00);
  args_1 = parsing::Token::location((Token *)&stack0xffffffffffffffb0);
  this_01 = BumpAllocator::
            emplace<slang::ast::TimingPathSymbol,slang::SourceLocation,slang::ast::TimingPathSymbol::ConnectionKind&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::EdgeKind&>
                      (&this_00->super_BumpAllocator,in_stack_ffffffffffffffc8,
                       (ConnectionKind *)args_1,(Polarity *)TVar4.info,TVar4._0_8_,args_4);
  Symbol::setSyntax(&this_01->super_Symbol,in_RSI);
  return this_01;
}

Assistant:

TimingPathSymbol& TimingPathSymbol::fromSyntax(const Scope& parent,
                                               const PathDeclarationSyntax& syntax) {
    Polarity polarity;
    switch (syntax.desc->polarityOperator.kind) {
        case TokenKind::Plus:
        case TokenKind::PlusEqual:
            polarity = Polarity::Positive;
            break;
        case TokenKind::Minus:
        case TokenKind::MinusEqual:
            polarity = Polarity::Negative;
            break;
        default:
            polarity = Polarity::Unknown;
            break;
    }

    auto connectionKind = syntax.desc->pathOperator.kind == TokenKind::StarArrow
                              ? ConnectionKind::Full
                              : ConnectionKind::Parallel;

    auto edgeIdentifier = SemanticFacts::getEdgeKind(syntax.desc->edgeIdentifier.kind);

    auto edgePolarity = Polarity::Unknown;
    if (syntax.desc->suffix->kind == SyntaxKind::EdgeSensitivePathSuffix) {
        auto& esps = syntax.desc->suffix->as<EdgeSensitivePathSuffixSyntax>();
        switch (esps.polarityOperator.kind) {
            case TokenKind::Plus:
            case TokenKind::PlusColon:
                edgePolarity = Polarity::Positive;
                break;
            case TokenKind::Minus:
            case TokenKind::MinusColon:
                edgePolarity = Polarity::Negative;
                break;
            default:
                break;
        }
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<TimingPathSymbol>(syntax.getFirstToken().location(), connectionKind,
                                                 polarity, edgePolarity, edgeIdentifier);
    result->setSyntax(syntax);
    return *result;
}